

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFWriter.cpp
# Opt level: O3

EStatusCode
PDFWriter::RecryptPDF
          (string *inOriginalPDFPath,string *inOriginalPDFPassword,string *inNewPDFPath,
          LogConfiguration *inLogConfiguration,PDFCreationSettings *inPDFCreationSettings,
          EPDFVersion inOveridePDFVersion)

{
  EStatusCode EVar1;
  IByteReaderWithPosition *inOriginalPDFStream;
  IByteWriterWithPosition *inNewPDFStream;
  OutputFile newPDF;
  InputFile originalPDF;
  OutputFile local_90;
  InputFile local_60;
  
  InputFile::InputFile(&local_60);
  OutputFile::OutputFile(&local_90);
  EVar1 = InputFile::OpenFile(&local_60,inOriginalPDFPath);
  if (EVar1 == eSuccess) {
    EVar1 = OutputFile::OpenFile(&local_90,inNewPDFPath,false);
    if (EVar1 == eSuccess) {
      inOriginalPDFStream = InputFile::GetInputStream(&local_60);
      inNewPDFStream = OutputFile::GetOutputStream(&local_90);
      EVar1 = RecryptPDF(inOriginalPDFStream,inOriginalPDFPassword,inNewPDFStream,inLogConfiguration
                         ,inPDFCreationSettings,inOveridePDFVersion);
    }
  }
  OutputFile::~OutputFile(&local_90);
  InputFile::~InputFile(&local_60);
  return EVar1;
}

Assistant:

PDFHummus::EStatusCode PDFWriter::RecryptPDF(
	const std::string& inOriginalPDFPath,
	const std::string& inOriginalPDFPassword,
	const std::string& inNewPDFPath,
	const LogConfiguration& inLogConfiguration,
	const PDFCreationSettings& inPDFCreationSettings,
	EPDFVersion inOveridePDFVersion) {

	InputFile originalPDF;
	OutputFile newPDF;

	EStatusCode status = originalPDF.OpenFile(inOriginalPDFPath);
	if (status != eSuccess)
		return status;

	status = newPDF.OpenFile(inNewPDFPath);
	if (status != eSuccess)
		return status;

	return PDFWriter::RecryptPDF(
		originalPDF.GetInputStream(),
		inOriginalPDFPassword,
		newPDF.GetOutputStream(),
		inLogConfiguration,
		inPDFCreationSettings,
		inOveridePDFVersion
		);
}